

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

i8 __thiscall idx2::DecodeTransformOrder(idx2 *this,u64 Input,v3i N3,str Output)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  idx2 *piVar5;
  idx2 *piVar6;
  ulong uVar7;
  uint uVar8;
  int local_14 [3];
  
  lVar4 = CONCAT44((int)((ulong)register0x00000008 >> 0x20),N3.field_0._8_4_);
  uVar2 = 1;
  local_14[0] = 1;
  if ((int)Input != 0) {
    uVar7 = (long)(int)Input - 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_14[0] = 1;
    if (uVar7 != 0) {
      local_14[0] = (int)(1L << (-((byte)lVar1 ^ 0x3f) & 0x3f));
    }
  }
  local_14[1] = 1;
  if (Input >> 0x20 != 0) {
    uVar7 = ((long)Input >> 0x20) - 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_14[1] = 1;
    if (uVar7 != 0) {
      local_14[1] = (int)(1L << (-((byte)lVar1 ^ 0x3f) & 0x3f));
    }
  }
  if (N3.field_0._0_4_ != 0) {
    uVar7 = (long)N3.field_0._0_4_ - 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = 1;
    if (uVar7 != 0) {
      uVar2 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f) & 0xffffffff;
    }
  }
  local_14[2] = (uint)uVar2;
  cVar3 = '\0';
  piVar6 = this;
  do {
    piVar5 = this;
    while( true ) {
      if ((ulong)((long)(int)uVar2 * (long)local_14[1] * (long)local_14[0]) < 2) {
        *(undefined1 *)(lVar4 + cVar3) = 0;
        return cVar3;
      }
      uVar8 = (uint)piVar5 & 3;
      this = (idx2 *)((ulong)piVar5 >> 2);
      if (uVar8 != 3) break;
      piVar5 = piVar6;
      if (this != (idx2 *)0x3) {
        piVar5 = this;
        piVar6 = this;
      }
    }
    *(byte *)(lVar4 + cVar3) = (byte)uVar8 | 0x58;
    local_14[(uint)piVar5 & 3] = local_14[(uint)piVar5 & 3] >> 1;
    cVar3 = cVar3 + '\x01';
    uVar2 = (ulong)(uint)local_14[2];
  } while( true );
}

Assistant:

i8
DecodeTransformOrder(u64 Input, v3i N3, str Output)
{
  N3 = v3i((int)NextPow2(N3.X), (int)NextPow2(N3.Y), (int)NextPow2(N3.Z));
  i8 Len = 0;
  u64 SavedInput = Input;
  while (Prod<u64>(N3) > 1)
  {
    int T = Input & 0x3;
    Input >>= 2;
    if (T == 3)
    {
      if (Input == 3)
        Input = SavedInput;
      else
        SavedInput = Input;
    }
    else
    {
      Output[Len++] = char('X' + T);
      N3[T] >>= 1;
    }
  }
  Output[Len] = '\0';
  return Len;
}